

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini2sf.cpp
# Opt level: O0

void printUsage(char *cmd)

{
  uint local_3c;
  int i;
  char *availableOptions [4];
  char *cmd_local;
  
  availableOptions[0] = "Show this help";
  availableOptions[1] = "--psfby, --2sfby [name]";
  availableOptions[2] = "Set creator name of 2SF";
  printf("%s %s\n","rom2sf","[2015-04-08]");
  printf("======================\n");
  printf("\n");
  printf("%s. Created by %s.\n","Numbered mini2sf generator",
         "loveemu <http://github.com/loveemu/rom2sf>");
  printf("\n");
  printf("Usage\n");
  printf("-----\n");
  printf("\n");
  printf("Syntax: `%s <Base name> <Offset> <Size> <Count>`\n",cmd);
  printf("\n");
  printf("### Options ###\n");
  printf("\n");
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 2) {
    printf("%s\n",availableOptions[(long)(int)local_3c + -1]);
    printf("  : %s\n",availableOptions[(long)(int)(local_3c + 1) + -1]);
    printf("\n");
  }
  return;
}

Assistant:

void printUsage(const char *cmd)
{
	const char *availableOptions[] = {
		"--help", "Show this help",
		"--psfby, --2sfby [name]", "Set creator name of 2SF",
	};

	printf("%s %s\n", APP_NAME, APP_VER);
	printf("======================\n");
	printf("\n");
	printf("%s. Created by %s.\n", APP_DESC, APP_AUTHOR);
	printf("\n");
	printf("Usage\n");
	printf("-----\n");
	printf("\n");
	printf("Syntax: `%s <Base name> <Offset> <Size> <Count>`\n", cmd);
	printf("\n");
	printf("### Options ###\n");
	printf("\n");

	for (int i = 0; i < sizeof(availableOptions) / sizeof(availableOptions[0]); i += 2)
	{
		printf("%s\n", availableOptions[i]);
		printf("  : %s\n", availableOptions[i + 1]);
		printf("\n");
	}
}